

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

void __thiscall
helics::MessageFederateManager::~MessageFederateManager(MessageFederateManager *this)

{
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this->messageOrder);
  std::
  deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
  ::~deque(&(this->eptData).m_obj);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->allCallback);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::
  ~DualStringMappedVector
            ((DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *)this);
  return;
}

Assistant:

MessageFederateManager::~MessageFederateManager() = default;